

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

char * GetPrevDirectoryPath(char *dirPath)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  memset(GetPrevDirectoryPath::prevDirPath,0,0x1000);
  sVar1 = strlen(dirPath);
  if ((int)(uint)sVar1 < 4) {
    pcVar2 = strcpy(GetPrevDirectoryPath::prevDirPath,dirPath);
    return pcVar2;
  }
  uVar4 = (ulong)((uint)sVar1 & 0x7fffffff) + 1;
  do {
    uVar3 = uVar4;
    uVar4 = uVar3 - 1;
    if ((long)uVar4 < 1) {
      return GetPrevDirectoryPath::prevDirPath;
    }
  } while ((dirPath[uVar3 - 2] != '\\') && (dirPath[uVar3 - 2] != '/'));
  if ((int)uVar4 != 1) {
    if ((int)uVar4 == 3) {
      if (dirPath[1] != ':') {
        uVar4 = 2;
      }
    }
    else {
      uVar4 = uVar3 - 2;
    }
  }
  pcVar2 = strncpy(GetPrevDirectoryPath::prevDirPath,dirPath,uVar4 & 0xffffffff);
  return pcVar2;
}

Assistant:

const char *GetPrevDirectoryPath(const char *dirPath)
{
    static char prevDirPath[MAX_FILEPATH_LENGTH];
    memset(prevDirPath, 0, MAX_FILEPATH_LENGTH);
    int pathLen = (int)strlen(dirPath);

    if (pathLen <= 3) strcpy(prevDirPath, dirPath);

    for (int i = (pathLen - 1); (i >= 0) && (pathLen > 3); i--)
    {
        if ((dirPath[i] == '\\') || (dirPath[i] == '/'))
        {
            // Check for root: "C:\" or "/"
            if (((i == 2) && (dirPath[1] ==':')) || (i == 0)) i++;

            strncpy(prevDirPath, dirPath, i);
            break;
        }
    }

    return prevDirPath;
}